

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::MergePartialFromCodedStream
          (BiDirectionalLSTMLayerParams *this,CodedInputStream *input)

{
  byte *pbVar1;
  uint8 *puVar2;
  bool bVar3;
  uint uVar4;
  uint32 uVar5;
  Type *this_00;
  Type *this_01;
  byte *pbVar6;
  LSTMParams *this_02;
  ulong extraout_RAX;
  pair<int,_int> pVar7;
  byte bVar8;
  uint64 *puVar9;
  char cVar10;
  int iVar11;
  ulong uVar12;
  RepeatedPtrFieldBase *this_03;
  int iVar13;
  pair<unsigned_long,_bool> pVar14;
  int local_64;
  
  do {
    pbVar6 = input->buffer_;
    uVar5 = 0;
    if (pbVar6 < input->buffer_end_) {
      bVar8 = *pbVar6;
      uVar12 = (ulong)bVar8;
      pbVar1 = pbVar6 + 1;
      uVar4 = (uint)bVar8;
      if ((char)bVar8 < '\x01') {
        uVar5 = (uint)bVar8;
        if ((input->buffer_end_ <= pbVar1) || (uVar5 = uVar4, (~(uint)*pbVar1 & uVar4) < 0x80))
        goto LAB_0022648d;
        uVar12 = (ulong)((uVar4 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar6 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar12 = uVar12 | 0x100000000;
    }
    else {
LAB_0022648d:
      uVar5 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar5);
      uVar12 = 0;
      if (uVar5 - 1 < 0x3fff) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar5 | uVar12;
    }
    uVar5 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto LAB_0022621f;
    uVar4 = (uint)(uVar12 >> 3) & 0x1fffffff;
    cVar10 = (char)uVar12;
    if (uVar4 < 0xb) {
      if (uVar4 == 1) {
        if (cVar10 != '\b') goto LAB_0022621f;
        pbVar6 = input->buffer_;
        if ((input->buffer_end_ <= pbVar6) ||
           (bVar8 = *pbVar6, puVar9 = &this->inputvectorsize_, (char)bVar8 < '\0')) {
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->inputvectorsize_ = pVar14.first;
          goto LAB_00226479;
        }
LAB_00226368:
        *puVar9 = (ulong)bVar8;
        input->buffer_ = pbVar6 + 1;
LAB_00226249:
        iVar13 = 0;
      }
      else {
        if (uVar4 == 2) {
          if (cVar10 != '\x10') goto LAB_0022621f;
          pbVar6 = input->buffer_;
          if ((pbVar6 < input->buffer_end_) &&
             (bVar8 = *pbVar6, puVar9 = &this->outputvectorsize_, -1 < (char)bVar8))
          goto LAB_00226368;
          pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->outputvectorsize_ = pVar14.first;
LAB_00226479:
          if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
          goto LAB_00226249;
        }
        else {
          if ((uVar4 == 10) &&
             (this_03 = &(this->activationsforwardlstm_).super_RepeatedPtrFieldBase, cVar10 == 'R'))
          goto LAB_00226313;
LAB_0022621f:
          iVar13 = 7;
          if ((uVar5 & 7) == 4 || uVar5 == 0) goto LAB_0022624c;
          bVar3 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar5);
          if (bVar3) goto LAB_00226249;
        }
        iVar13 = 6;
      }
    }
    else if (uVar4 == 0xb) {
      this_03 = &(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase;
      if (cVar10 != 'Z') goto LAB_0022621f;
LAB_00226313:
      this_01 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                          (this_03,(Type *)0x0);
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (iVar11 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
        input->buffer_ = puVar2 + 1;
        bVar3 = true;
      }
      else {
        iVar11 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar3 = -1 < iVar11;
      }
      iVar13 = 6;
      if ((bVar3) &&
         (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar11), -1 < (long)pVar7)) {
        bVar3 = ActivationParams::MergePartialFromCodedStream(this_01,input);
LAB_00226449:
        iVar13 = 6;
        if ((bVar3 != false) &&
           (bVar3 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                              (input,pVar7.first), bVar3)) goto LAB_00226249;
      }
    }
    else if (uVar4 == 0xf) {
      if (cVar10 != 'z') goto LAB_0022621f;
      if (this->params_ == (LSTMParams *)0x0) {
        this_02 = (LSTMParams *)operator_new(0x20);
        LSTMParams::LSTMParams(this_02);
        this->params_ = this_02;
      }
      MergePartialFromCodedStream();
      iVar13 = local_64;
      if ((extraout_RAX & 1) == 0) goto LAB_00226249;
    }
    else {
      if ((uVar4 != 0x14) || (cVar10 != -0x5e)) goto LAB_0022621f;
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Add<google::protobuf::RepeatedPtrField<CoreML::Specification::LSTMWeightParams>::TypeHandler>
                          (&(this->weightparams_).super_RepeatedPtrFieldBase,(Type *)0x0);
      puVar2 = input->buffer_;
      if ((puVar2 < input->buffer_end_) && (iVar11 = (int)(char)*puVar2, -1 < (char)*puVar2)) {
        input->buffer_ = puVar2 + 1;
        bVar3 = true;
      }
      else {
        iVar11 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
        bVar3 = -1 < iVar11;
      }
      iVar13 = 6;
      if ((bVar3) &&
         (pVar7 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar11), -1 < (long)pVar7)) {
        bVar3 = LSTMWeightParams::MergePartialFromCodedStream(this_00,input);
        goto LAB_00226449;
      }
    }
LAB_0022624c:
    if (iVar13 != 0) {
      return iVar13 != 6;
    }
  } while( true );
}

Assistant:

bool BiDirectionalLSTMLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.BiDirectionalLSTMLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // uint64 inputVectorSize = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(8u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &inputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 outputVectorSize = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &outputvectorsize_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsForwardLSTM = 10;
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(82u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsforwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.ActivationParams activationsBackwardLSTM = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(90u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_activationsbackwardlstm()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.LSTMParams params = 15;
      case 15: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(122u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_params()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated .CoreML.Specification.LSTMWeightParams weightParams = 20;
      case 20: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(162u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weightparams()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.BiDirectionalLSTMLayerParams)
  return false;
#undef DO_
}